

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O3

UChar * __thiscall
icu_63::UCharsTrie::Iterator::branchNext
          (Iterator *this,UChar *pos,int32_t length,UErrorCode *errorCode)

{
  short sVar1;
  UChar UVar2;
  UChar UVar3;
  UVector32 *pUVar4;
  char16_t *pcVar5;
  bool bVar6;
  UBool UVar7;
  uint uVar8;
  long lVar9;
  UChar *pUVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  UChar *pUVar14;
  UChar local_3a;
  UChar *local_38;
  
  uVar13 = length;
  if (5 < length) {
    do {
      pUVar14 = pos + 2;
      pUVar10 = pUVar14;
      if (0xfbff < (ushort)pos[1]) {
        if (pos[1] == L'\xffff') {
          pUVar10 = pos + 4;
        }
        else {
          pUVar10 = pos + 3;
        }
      }
      pUVar4 = this->stack_;
      pcVar5 = this->uchars_;
      iVar12 = pUVar4->count;
      if ((iVar12 < -1) || (pUVar4->capacity <= iVar12)) {
        UVar7 = UVector32::expandCapacity(pUVar4,iVar12 + 1,errorCode);
        if (UVar7 != '\0') {
          iVar12 = pUVar4->count;
          goto LAB_002b7f54;
        }
      }
      else {
LAB_002b7f54:
        pUVar4->elements[iVar12] = (int32_t)((ulong)((long)pUVar10 - (long)pcVar5) >> 1);
        pUVar4->count = pUVar4->count + 1;
      }
      pUVar4 = this->stack_;
      sVar1 = (this->str_).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar8 = (this->str_).fUnion.fFields.fLength;
      }
      else {
        uVar8 = (int)sVar1 >> 5;
      }
      length = uVar13 >> 1;
      iVar12 = pUVar4->count;
      if ((iVar12 < -1) || (pUVar4->capacity <= iVar12)) {
        UVar7 = UVector32::expandCapacity(pUVar4,iVar12 + 1,errorCode);
        if (UVar7 != '\0') {
          iVar12 = pUVar4->count;
          goto LAB_002b7faa;
        }
      }
      else {
LAB_002b7faa:
        pUVar4->elements[iVar12] = uVar8 | (uVar13 - length) * 0x10000;
        pUVar4->count = pUVar4->count + 1;
      }
      UVar2 = pos[1];
      uVar8 = (uint)(ushort)UVar2;
      if (0xfbff < (ushort)UVar2) {
        if (UVar2 == L'\xffff') {
          uVar8 = CONCAT22(pos[2],pos[3]);
          pUVar14 = pos + 4;
        }
        else {
          pUVar14 = pos + 3;
          uVar8 = (uint)(ushort)UVar2 * 0x10000 + (uint)(ushort)pos[2] + 0x4000000;
        }
      }
      pos = pUVar14 + (int)uVar8;
      bVar6 = 0xb < uVar13;
      uVar13 = length;
    } while (bVar6);
  }
  local_38 = pos + 2;
  UVar2 = pos[1];
  uVar13 = (ushort)UVar2 & 0x7fff;
  if (0x3fff < uVar13) {
    if (uVar13 == 0x7fff) {
      uVar13 = (uint)(ushort)pos[2] << 0x10;
      local_38 = pos + 3;
      lVar9 = 8;
    }
    else {
      uVar13 = uVar13 * 0x10000 + 0xc0000000;
      lVar9 = 6;
    }
    uVar13 = (ushort)*local_38 | uVar13;
    local_38 = (UChar *)(lVar9 + (long)pos);
  }
  UVar3 = *pos;
  pUVar4 = this->stack_;
  uVar11 = (long)local_38 - (long)this->uchars_;
  iVar12 = pUVar4->count;
  if ((iVar12 < -1) || (pUVar4->capacity <= iVar12)) {
    UVar7 = UVector32::expandCapacity(pUVar4,iVar12 + 1,errorCode);
    if (UVar7 != '\0') {
      iVar12 = pUVar4->count;
      goto LAB_002b80a9;
    }
  }
  else {
LAB_002b80a9:
    pUVar4->elements[iVar12] = (int32_t)(uVar11 >> 1);
    pUVar4->count = pUVar4->count + 1;
  }
  pUVar4 = this->stack_;
  sVar1 = (this->str_).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar8 = (this->str_).fUnion.fFields.fLength;
  }
  else {
    uVar8 = (int)sVar1 >> 5;
  }
  iVar12 = pUVar4->count;
  if ((iVar12 < -1) || (pUVar4->capacity <= iVar12)) {
    UVar7 = UVector32::expandCapacity(pUVar4,iVar12 + 1,errorCode);
    if (UVar7 == '\0') goto LAB_002b8117;
    iVar12 = pUVar4->count;
  }
  pUVar4->elements[iVar12] = uVar8 | length * 0x10000 - 0x10000U;
  pUVar4->count = pUVar4->count + 1;
LAB_002b8117:
  local_3a = UVar3;
  UnicodeString::doAppend(&this->str_,&local_3a,0,1);
  if (UVar2 < L'\0') {
    this->pos_ = (char16_t *)0x0;
    this->value_ = uVar13;
    local_38 = (UChar *)0x0;
  }
  else {
    local_38 = local_38 + (int)uVar13;
  }
  return local_38;
}

Assistant:

const UChar *
UCharsTrie::Iterator::branchNext(const UChar *pos, int32_t length, UErrorCode &errorCode) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        // Push state for the greater-or-equal edge.
        stack_->addElement((int32_t)(skipDelta(pos)-uchars_), errorCode);
        stack_->addElement(((length-(length>>1))<<16)|str_.length(), errorCode);
        // Follow the less-than edge.
        length>>=1;
        pos=jumpByDelta(pos);
    }
    // List of key-value pairs where values are either final values or jump deltas.
    // Read the first (key, value) pair.
    UChar trieUnit=*pos++;
    int32_t node=*pos++;
    UBool isFinal=(UBool)(node>>15);
    int32_t value=readValue(pos, node&=0x7fff);
    pos=skipValue(pos, node);
    stack_->addElement((int32_t)(pos-uchars_), errorCode);
    stack_->addElement(((length-1)<<16)|str_.length(), errorCode);
    str_.append(trieUnit);
    if(isFinal) {
        pos_=NULL;
        value_=value;
        return NULL;
    } else {
        return pos+value;
    }
}